

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

int UTF8ToHtml(uchar *out,int *outlen,uchar *in,int *inlen)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  htmlEntityDesc *phVar8;
  size_t sVar9;
  int *piVar10;
  char local_88 [8];
  char nbuf [16];
  char *cp;
  htmlEntityDesc *ent;
  int len;
  int trailing;
  uint d;
  uint c;
  uchar *inend;
  uchar *instart;
  uchar *outstart;
  uchar *outend;
  uchar *processed;
  int *inlen_local;
  uchar *in_local;
  int *outlen_local;
  uchar *out_local;
  
  if (((out == (uchar *)0x0) || (outlen == (int *)0x0)) || (inlen == (int *)0x0)) {
    out_local._4_4_ = -1;
  }
  else if (in == (uchar *)0x0) {
    *outlen = 0;
    *inlen = 0;
    out_local._4_4_ = 0;
  }
  else {
    piVar7 = (int *)(in + *inlen);
    iVar1 = *outlen;
    inlen_local = (int *)in;
    outlen_local = (int *)out;
    while( true ) {
      iVar2 = (int)outlen_local;
      iVar3 = (int)out;
      iVar4 = (int)inlen_local;
      iVar5 = (int)in;
      if (piVar7 <= inlen_local) break;
      piVar10 = (int *)((long)inlen_local + 1);
      trailing = (int)(byte)*inlen_local;
      if ((uint)trailing < 0x80) {
        ent._4_4_ = 0;
      }
      else {
        if ((uint)trailing < 0xc0) {
          *outlen = iVar2 - iVar3;
          *inlen = iVar4 - iVar5;
          return -2;
        }
        if ((uint)trailing < 0xe0) {
          trailing = trailing & 0x1f;
          ent._4_4_ = 1;
        }
        else if ((uint)trailing < 0xf0) {
          trailing = trailing & 0xf;
          ent._4_4_ = 2;
        }
        else {
          if (0xf7 < (uint)trailing) {
            *outlen = iVar2 - iVar3;
            *inlen = iVar4 - iVar5;
            return -2;
          }
          trailing = trailing & 7;
          ent._4_4_ = 3;
        }
      }
      inlen_local = piVar10;
      if ((long)piVar7 - (long)piVar10 < (long)ent._4_4_) break;
      while ((ent._4_4_ != 0 && (inlen_local < piVar7))) {
        piVar10 = (int *)((long)inlen_local + 1);
        iVar6 = *inlen_local;
        inlen_local = piVar10;
        if (((byte)iVar6 & 0xc0) != 0x80) break;
        trailing = (byte)iVar6 & 0x3f | trailing << 6;
        ent._4_4_ = ent._4_4_ + -1;
      }
      if ((uint)trailing < 0x80) {
        if (out + iVar1 <= (uchar *)((long)outlen_local + 1U)) break;
        *(char *)outlen_local = (char)trailing;
      }
      else {
        phVar8 = htmlEntityValueLookup(trailing);
        if (phVar8 == (htmlEntityDesc *)0x0) {
          snprintf(local_88,0x10,"#%u",(ulong)(uint)trailing);
          nbuf._8_8_ = local_88;
        }
        else {
          nbuf._8_8_ = phVar8->name;
        }
        sVar9 = strlen((char *)nbuf._8_8_);
        iVar6 = (int)sVar9;
        if (out + iVar1 <= (uchar *)((long)outlen_local + (long)iVar6 + 2)) break;
        *(undefined1 *)outlen_local = 0x26;
        memcpy((void *)((long)outlen_local + 1),(void *)nbuf._8_8_,(long)iVar6);
        outlen_local = (int *)((long)outlen_local + 1 + (long)iVar6);
        *(undefined1 *)outlen_local = 0x3b;
      }
      outlen_local = (int *)((long)outlen_local + 1);
    }
    *outlen = iVar2 - iVar3;
    *inlen = iVar4 - iVar5;
    out_local._4_4_ = 0;
  }
  return out_local._4_4_;
}

Assistant:

int
UTF8ToHtml(unsigned char* out, int *outlen,
              const unsigned char* in, int *inlen) {
    const unsigned char* processed = in;
    const unsigned char* outend;
    const unsigned char* outstart = out;
    const unsigned char* instart = in;
    const unsigned char* inend;
    unsigned int c, d;
    int trailing;

    if ((out == NULL) || (outlen == NULL) || (inlen == NULL)) return(-1);
    if (in == NULL) {
        /*
	 * initialization nothing to do
	 */
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    inend = in + (*inlen);
    outend = out + (*outlen);
    while (in < inend) {
	d = *in++;
	if      (d < 0x80)  { c= d; trailing= 0; }
	else if (d < 0xC0) {
	    /* trailing byte in leading position */
	    *outlen = out - outstart;
	    *inlen = processed - instart;
	    return(-2);
        } else if (d < 0xE0)  { c= d & 0x1F; trailing= 1; }
        else if (d < 0xF0)  { c= d & 0x0F; trailing= 2; }
        else if (d < 0xF8)  { c= d & 0x07; trailing= 3; }
	else {
	    /* no chance for this in Ascii */
	    *outlen = out - outstart;
	    *inlen = processed - instart;
	    return(-2);
	}

	if (inend - in < trailing) {
	    break;
	}

	for ( ; trailing; trailing--) {
	    if ((in >= inend) || (((d= *in++) & 0xC0) != 0x80))
		break;
	    c <<= 6;
	    c |= d & 0x3F;
	}

	/* assertion: c is a single UTF-4 value */
	if (c < 0x80) {
	    if (out + 1 >= outend)
		break;
	    *out++ = c;
	} else {
	    int len;
	    const htmlEntityDesc * ent;
	    const char *cp;
	    char nbuf[16];

	    /*
	     * Try to lookup a predefined HTML entity for it
	     */

	    ent = htmlEntityValueLookup(c);
	    if (ent == NULL) {
	      snprintf(nbuf, sizeof(nbuf), "#%u", c);
	      cp = nbuf;
	    }
	    else
	      cp = ent->name;
	    len = strlen(cp);
	    if (out + 2 + len >= outend)
		break;
	    *out++ = '&';
	    memcpy(out, cp, len);
	    out += len;
	    *out++ = ';';
	}
	processed = in;
    }
    *outlen = out - outstart;
    *inlen = processed - instart;
    return(0);
}